

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname,string_view name)

{
  pointer puVar1;
  Host *pHVar2;
  pointer puVar3;
  __uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
  _Var4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  byte unaff_BPL;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  *content;
  pointer puVar8;
  pointer puVar9;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_50._M_str = name._M_str;
  pcVar7 = (char *)name._M_len;
  local_40._M_str = hostname._M_str;
  local_40._M_len = hostname._M_len;
  local_50._M_len = (size_t)pcVar7;
  uVar6 = calc_checksumi<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                    (&local_40);
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->m_hosts).
                super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    pHVar2 = (puVar9->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    if (uVar6 == (pHVar2->super_Directory).name_checksum) {
      rhs._M_str = pcVar7;
      rhs._M_len = (size_t)local_40._M_str;
      bVar5 = jessilib::equalsi<char,char>
                        ((jessilib *)&(pHVar2->super_Directory).name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40._M_len,rhs);
      if (bVar5) {
        uVar6 = calc_checksum<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                          (&local_50);
        pHVar2 = (puVar9->_M_t).
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
        puVar8 = *(pointer *)
                  &(pHVar2->super_Directory).content.
                   super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                   ._M_impl;
        puVar3 = *(pointer *)((long)&(pHVar2->super_Directory).content + 8);
        goto LAB_0013abaa;
      }
    }
  }
LAB_0013abdd:
  return (bool)(puVar9 != puVar1 & unaff_BPL);
LAB_0013abaa:
  bVar5 = puVar8 == puVar3;
  unaff_BPL = !bVar5;
  if (bVar5) goto LAB_0013abdd;
  _Var4.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (puVar8->_M_t).
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ;
  if (uVar6 == *(uint *)((long)_Var4.
                               super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                               .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>.
                               _M_head_impl + 0x38)) {
    __x._M_str = local_50._M_str;
    __x._M_len = local_50._M_len;
    __y._M_str = *(char **)((long)_Var4.
                                  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>.
                                  _M_head_impl + 0x18);
    __y._M_len = *(size_t *)
                  ((long)_Var4.
                         super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                         .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>.
                         _M_head_impl + 0x20);
    bVar5 = std::operator==(__x,__y);
    if (bVar5) goto LAB_0013abdd;
  }
  puVar8 = puVar8 + 1;
  goto LAB_0013abaa;
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname, std::string_view name) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			name_checksum = calc_checksum(name); // switch to equalsi to make case-insensitive
			for (const auto& content : host->content) {
				if (name_checksum == content->name_checksum && content->name == name) { // switch to equalsi to make case-insensitive
					return true;
				}
			}
			return false;
		}
	}
	return false;
}